

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# liolib.c
# Opt level: O3

int g_read(lua_State *L,FILE *f,int first)

{
  byte bVar1;
  char cVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  int *piVar8;
  size_t sVar9;
  char *pcVar10;
  size_t sVar11;
  lconv *plVar12;
  ushort **ppuVar13;
  uint uVar14;
  int iVar15;
  bool bVar16;
  char *local_470;
  luaL_Buffer local_450;
  
  iVar3 = lua_gettop(L);
  clearerr((FILE *)f);
  piVar8 = __errno_location();
  *piVar8 = 0;
  if (iVar3 == 1) {
    uVar4 = read_line(L,f,1);
    iVar15 = first + 1;
  }
  else {
    luaL_checkstack(L,iVar3 + 0x13,"too many arguments");
    iVar3 = iVar3 + -2;
    iVar15 = first;
    do {
      iVar5 = lua_type(L,iVar15);
      if (iVar5 == 3) {
        sVar9 = luaL_checkinteger(L,iVar15);
        if (sVar9 == 0) {
          iVar5 = getc((FILE *)f);
          ungetc(iVar5,(FILE *)f);
          lua_pushstring(L,"");
          bVar16 = iVar5 == -1;
        }
        else {
          luaL_buffinit(L,&local_450);
          pcVar10 = luaL_prepbuffsize(&local_450,sVar9);
          sVar11 = fread(pcVar10,1,sVar9,(FILE *)f);
          local_450.n = local_450.n + sVar11;
          luaL_pushresult(&local_450);
          bVar16 = sVar11 == 0;
        }
        uVar4 = (uint)!bVar16;
      }
      else {
        pcVar10 = luaL_checklstring(L,iVar15,(size_t *)0x0);
        bVar1 = pcVar10[*pcVar10 == '*'];
        if (bVar1 < 0x6c) {
          if (bVar1 == 0x4c) {
            iVar5 = 0;
LAB_00123bae:
            uVar4 = read_line(L,f,iVar5);
          }
          else {
            if (bVar1 != 0x61) {
LAB_00123d25:
              iVar3 = luaL_argerror(L,iVar15,"invalid format");
              return iVar3;
            }
            luaL_buffinit(L,&local_450);
            do {
              pcVar10 = luaL_prepbuffsize(&local_450,0x400);
              sVar11 = fread(pcVar10,1,0x400,(FILE *)f);
              local_450.n = local_450.n + sVar11;
            } while (sVar11 == 0x400);
            luaL_pushresult(&local_450);
            uVar4 = 1;
          }
        }
        else {
          if (bVar1 == 0x6c) {
            iVar5 = 1;
            goto LAB_00123bae;
          }
          if (bVar1 != 0x6e) goto LAB_00123d25;
          local_450.size._4_4_ = 0;
          local_450.b = (char *)f;
          plVar12 = localeconv();
          cVar2 = *plVar12->decimal_point;
          flockfile((FILE *)f);
          do {
            uVar4 = getc_unlocked((FILE *)f);
            ppuVar13 = __ctype_b_loc();
          } while ((*(byte *)((long)*ppuVar13 + (long)(int)uVar4 * 2 + 1) & 0x20) != 0);
          local_450.size._0_4_ = uVar4;
          if ((uVar4 == 0x2d) || (uVar4 == 0x2b)) {
            nextc((RN *)&local_450);
          }
          uVar4 = 0;
          if ((uint)local_450.size == 0x30) {
            iVar5 = nextc((RN *)&local_450);
            if (iVar5 == 0) {
              uVar14 = 0;
            }
            else {
              if (((uint)local_450.size | 0x20) == 0x78) {
                uVar6 = nextc((RN *)&local_450);
                uVar14 = uVar6 ^ 1;
                uVar4 = (uint)(uVar6 != 0);
                local_470 = "eE";
                if (uVar6 != 0) {
                  local_470 = "pP";
                }
                goto LAB_00123be2;
              }
              uVar14 = 1;
            }
            local_470 = "eE";
            uVar4 = 0;
          }
          else {
            uVar14 = 0;
            local_470 = "eE";
          }
LAB_00123be2:
          iVar5 = readdigits((RN *)&local_450,uVar4);
          iVar5 = iVar5 + uVar14;
          if (((uint)local_450.size == (int)cVar2 || (uint)local_450.size == 0x2e) &&
             (iVar7 = nextc((RN *)&local_450), iVar7 != 0)) {
            iVar7 = readdigits((RN *)&local_450,uVar4);
            iVar5 = iVar5 + iVar7;
          }
          if ((0 < iVar5) &&
             ((((uint)local_450.size == (int)*local_470 ||
               ((uint)local_450.size == (int)local_470[1])) &&
              (iVar5 = nextc((RN *)&local_450), iVar5 != 0)))) {
            if (((uint)local_450.size == 0x2d) || ((uint)local_450.size == 0x2b)) {
              nextc((RN *)&local_450);
            }
            readdigits((RN *)&local_450,0);
          }
          pcVar10 = local_450.b;
          ungetc((uint)local_450.size,(FILE *)local_450.b);
          funlockfile((FILE *)pcVar10);
          *(undefined1 *)((long)&local_450.n + (long)local_450.size._4_4_) = 0;
          sVar9 = lua_stringtonumber(L,(char *)&local_450.n);
          uVar4 = 1;
          if (sVar9 == 0) {
            lua_pushnil(L);
            uVar4 = 0;
          }
        }
      }
      iVar15 = iVar15 + 1;
      bVar16 = iVar3 != 0;
      iVar3 = iVar3 + -1;
    } while ((bVar16) && (uVar4 != 0));
  }
  iVar3 = ferror((FILE *)f);
  if (iVar3 == 0) {
    if (uVar4 == 0) {
      lua_settop(L,-2);
      lua_pushnil(L);
    }
    iVar15 = iVar15 - first;
  }
  else {
    iVar15 = luaL_fileresult(L,0,(char *)0x0);
  }
  return iVar15;
}

Assistant:

static int g_read (lua_State *L, FILE *f, int first) {
  int nargs = lua_gettop(L) - 1;
  int n, success;
  clearerr(f);
  errno = 0;
  if (nargs == 0) {  /* no arguments? */
    success = read_line(L, f, 1);
    n = first + 1;  /* to return 1 result */
  }
  else {
    /* ensure stack space for all results and for auxlib's buffer */
    luaL_checkstack(L, nargs+LUA_MINSTACK, "too many arguments");
    success = 1;
    for (n = first; nargs-- && success; n++) {
      if (lua_type(L, n) == LUA_TNUMBER) {
        size_t l = (size_t)luaL_checkinteger(L, n);
        success = (l == 0) ? test_eof(L, f) : read_chars(L, f, l);
      }
      else {
        const char *p = luaL_checkstring(L, n);
        if (*p == '*') p++;  /* skip optional '*' (for compatibility) */
        switch (*p) {
          case 'n':  /* number */
            success = read_number(L, f);
            break;
          case 'l':  /* line */
            success = read_line(L, f, 1);
            break;
          case 'L':  /* line with end-of-line */
            success = read_line(L, f, 0);
            break;
          case 'a':  /* file */
            read_all(L, f);  /* read entire file */
            success = 1; /* always success */
            break;
          default:
            return luaL_argerror(L, n, "invalid format");
        }
      }
    }
  }
  if (ferror(f))
    return luaL_fileresult(L, 0, NULL);
  if (!success) {
    lua_pop(L, 1);  /* remove last result */
    luaL_pushfail(L);  /* push nil instead */
  }
  return n - first;
}